

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void vocremfd(voccxdef *ctx,vocddef *what,objnum func,prpnum prop,runsdef *val,int err)

{
  int err_local;
  runsdef *val_local;
  prpnum prop_local;
  objnum func_local;
  vocddef *what_local;
  voccxdef *ctx_local;
  
  return;
}

Assistant:

void vocremfd(voccxdef *ctx, vocddef *what, objnum func, prpnum prop,
              runsdef *val, int err)
{
    VARUSED(ctx);
    VARUSED(what);
    VARUSED(func);
    VARUSED(prop);
    VARUSED(val);
    VARUSED(err);
}